

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O3

void bubble_down(nghttp2_pq *pq,size_t index)

{
  nghttp2_pq_entry **ppnVar1;
  nghttp2_pq_entry *pnVar2;
  nghttp2_pq_entry *pnVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  size_t sVar8;
  
  do {
    uVar7 = index * 2;
    sVar8 = index;
    bVar4 = true;
    do {
      bVar6 = bVar4;
      uVar7 = uVar7 + 1;
      if (pq->length <= uVar7) break;
      iVar5 = (*pq->less)(pq->q[uVar7],pq->q[sVar8]);
      if (iVar5 != 0) {
        sVar8 = uVar7;
      }
      bVar4 = false;
    } while (bVar6);
    if (sVar8 == index) {
      return;
    }
    ppnVar1 = pq->q;
    pnVar2 = ppnVar1[index];
    pnVar3 = ppnVar1[sVar8];
    ppnVar1[index] = pnVar3;
    pnVar3->index = index;
    pq->q[sVar8] = pnVar2;
    pnVar2->index = sVar8;
    index = sVar8;
  } while( true );
}

Assistant:

static void bubble_down(nghttp2_pq *pq, size_t index) {
  size_t i, j, minindex;
  for (;;) {
    j = index * 2 + 1;
    minindex = index;
    for (i = 0; i < 2; ++i, ++j) {
      if (j >= pq->length) {
        break;
      }
      if (pq->less(pq->q[j], pq->q[minindex])) {
        minindex = j;
      }
    }
    if (minindex == index) {
      return;
    }
    swap(pq, index, minindex);
    index = minindex;
  }
}